

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge-segments.cpp
# Opt level: O1

void __thiscall
msdfgen::QuadraticSegment::QuadraticSegment
          (QuadraticSegment *this,Point2 p0,Point2 p1,Point2 p2,EdgeColor edgeColor)

{
  bool bVar1;
  long lVar2;
  Vector2 VVar3;
  Vector2 local_50;
  Vector2 local_40;
  Vector2 local_30;
  Vector2 local_20;
  
  local_40.y = p2.y;
  local_40.x = p2.x;
  local_50.y = p1.y;
  local_50.x = p1.x;
  local_30.y = p0.y;
  local_30.x = p0.x;
  (this->super_EdgeSegment).color = edgeColor;
  (this->super_EdgeSegment)._vptr_EdgeSegment = (_func_int **)&PTR__EdgeSegment_001b0110;
  lVar2 = 0x10;
  do {
    Vector2::Vector2((Vector2 *)
                     ((long)&(((QuadraticSegment *)(this->p + -1))->super_EdgeSegment).
                             _vptr_EdgeSegment + lVar2),0.0);
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x40);
  bVar1 = Vector2::operator==(&local_50,&local_30);
  if (!bVar1) {
    bVar1 = Vector2::operator==(&local_50,&local_40);
    if (!bVar1) goto LAB_0016acbd;
  }
  VVar3 = Vector2::operator+(&local_30,&local_40);
  local_20.y = VVar3.y;
  local_20.x = VVar3.x;
  VVar3 = operator*(0.5,&local_20);
  local_50.y = VVar3.y;
  local_50.x = VVar3.x;
LAB_0016acbd:
  this->p[0].x = local_30.x;
  this->p[0].y = local_30.y;
  this->p[1].x = local_50.x;
  this->p[1].y = local_50.y;
  this->p[2].x = local_40.x;
  this->p[2].y = local_40.y;
  return;
}

Assistant:

QuadraticSegment::QuadraticSegment(Point2 p0, Point2 p1, Point2 p2, EdgeColor edgeColor) : EdgeSegment(edgeColor) {
    if (p1 == p0 || p1 == p2)
        p1 = 0.5*(p0+p2);
    p[0] = p0;
    p[1] = p1;
    p[2] = p2;
}